

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O0

void __thiscall
helics::helicsCLI11App::helicsCLI11App
          (helicsCLI11App *this,string *app_description,string *app_name)

{
  string *in_RDI;
  undefined8 in_stack_fffffffffffffd28;
  undefined1 immediate;
  App *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *in_stack_fffffffffffffd60;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *in_stack_fffffffffffffd78;
  App *in_stack_fffffffffffffd80;
  undefined1 config_required;
  string *help_message;
  string *in_stack_fffffffffffffdb8;
  App *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffdd8;
  App *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffdf8;
  App *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  App *in_stack_fffffffffffffe10;
  allocator<char> local_1c9 [40];
  allocator<char> local_1a1 [25];
  App *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  App *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_151;
  allocator<char> local_129 [40];
  allocator<char> local_101 [40];
  allocator<char> local_d9 [40];
  allocator<char> local_b1 [40];
  string local_89 [4];
  
  immediate = (undefined1)((ulong)in_stack_fffffffffffffd28 >> 0x38);
  std::__cxx11::string::string(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::__cxx11::string::string(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  CLI::App::App(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                in_stack_fffffffffffffe78);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd30);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd30);
  (in_RDI->_M_dataplus)._M_p = (pointer)&PTR__helicsCLI11App_00a42710;
  *(undefined1 *)&in_RDI[0x1b]._M_dataplus._M_p = 0;
  *(undefined1 *)((long)&in_RDI[0x1b]._M_dataplus._M_p + 1) = 1;
  *(undefined4 *)((long)&in_RDI[0x1b]._M_dataplus._M_p + 4) = 0;
  CLI::std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)0x18c6bb);
  config_required = (undefined1)((ulong)(in_RDI + 0x1c) >> 0x38);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x18c6d4);
  *(undefined4 *)((long)&in_RDI[0x1c].field_2 + 8) = 0;
  help_message = local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  CLI::App::set_help_flag
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd30);
  std::allocator<char>::~allocator(local_b1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd30);
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  CLI::App::set_config
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_RDI,help_message,
             (bool)config_required);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd30);
  std::allocator<char>::~allocator(local_129);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd30);
  std::allocator<char>::~allocator(local_101);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd30);
  std::allocator<char>::~allocator(local_d9);
  this_01 = &local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  __s = &stack0xfffffffffffffe87;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,in_stack_fffffffffffffd60);
  __a = local_1a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  CLI::App::set_version_flag
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(string *)in_stack_fffffffffffffdd0
             ,in_stack_fffffffffffffdc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd30);
  std::allocator<char>::~allocator((allocator<char> *)local_1a1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd30);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe87);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd30);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  CLI::App::add_option_group<CLI::Option_group>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  CLI::App::immediate_callback(in_stack_fffffffffffffd30,(bool)immediate);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffdbf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(bool *)in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdf8);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdbf);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffde7);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe0f);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator(local_1c9);
  return;
}

Assistant:

explicit helicsCLI11App(std::string app_description = "", const std::string& app_name = ""):
        CLI::App(std::move(app_description), app_name, nullptr)
    {
        set_help_flag("-h,-?,--help", "Print this help message and exit");
        set_config("--config-file,--config",
                   "helics_config.toml",
                   "specify base configuration file");
        set_version_flag("--version", helics::versionString);
        add_option_group("quiet")->immediate_callback()->add_flag("--quiet",
                                                                  quiet,
                                                                  "silence most print output");
    }